

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlLoadCatalogs(char *pathss)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  xmlChar *filename;
  long lVar5;
  
  if (pathss != (char *)0x0) {
    bVar2 = *pathss;
    while (bVar2 != 0) {
      while (uVar4 = (ulong)bVar2, bVar2 < 0x21) {
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 == 0) goto LAB_0013ba64;
          break;
        }
        pbVar1 = (xmlChar *)pathss + 1;
        pathss = (char *)((xmlChar *)pathss + 1);
        bVar2 = *pbVar1;
      }
      lVar5 = 0;
      while ((0x3a < (byte)uVar4 || ((0x400000100002601U >> (uVar4 & 0x3f) & 1) == 0))) {
        lVar3 = lVar5 + 1;
        lVar5 = lVar5 + 1;
        uVar4 = (ulong)((xmlChar *)pathss)[lVar3];
      }
      filename = xmlStrndup((xmlChar *)pathss,(int)lVar5);
      pathss = (char *)((xmlChar *)pathss + lVar5);
      if (filename != (xmlChar *)0x0) {
        xmlLoadCatalog((char *)filename);
        (*xmlFree)(filename);
      }
LAB_0013ba64:
      pathss = (char *)((xmlChar *)pathss + -1);
      do {
        bVar2 = ((xmlChar *)pathss)[1];
        pathss = (char *)((xmlChar *)pathss + 1);
      } while (bVar2 == 0x3a);
    }
  }
  return;
}

Assistant:

void
xmlLoadCatalogs(const char *pathss) {
    const char *cur;
    const char *paths;
    xmlChar *path;
#ifdef _WIN32
    int i, iLen;
#endif

    if (pathss == NULL)
	return;

    cur = pathss;
    while (*cur != 0) {
	while (xmlIsBlank_ch(*cur)) cur++;
	if (*cur != 0) {
	    paths = cur;
	    while ((*cur != 0) && (*cur != PATH_SEPARATOR) && (!xmlIsBlank_ch(*cur)))
		cur++;
	    path = xmlStrndup((const xmlChar *)paths, cur - paths);
	    if (path != NULL) {
#ifdef _WIN32
        iLen = strlen((const char*)path);
        for(i = 0; i < iLen; i++) {
            if(path[i] == '\\') {
                path[i] = '/';
            }
        }
#endif
		xmlLoadCatalog((const char *) path);
		xmlFree(path);
	    }
	}
	while (*cur == PATH_SEPARATOR)
	    cur++;
    }
}